

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_builtin(CompilerMSL *this,string *ep_args)

{
  ID id;
  uint uVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  size_t sVar3;
  bool bVar4;
  BuiltIn bi_type;
  uint32_t uVar5;
  ExecutionModel EVar6;
  IndexType IVar7;
  CompilerMSL *var_00;
  SPIRType *pSVar8;
  SPIREntryPoint *pSVar9;
  SPIRVariable *pSVar10;
  SPIRConstant *pSVar11;
  SPIRFunction *pSVar12;
  CompilerError *pCVar13;
  uint32_t *puVar14;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *var;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *ppVar15;
  long lVar16;
  string *this_00;
  string *in_R8;
  undefined8 in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  ParsedIR *local_130;
  uint32_t outer_factor_initializer_id;
  Bitset *local_108;
  LoopLock local_100;
  uint32_t inner_factor_initializer_id;
  TypedID<(spirv_cross::Types)0> *local_d8;
  long local_d0;
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> active_builtins;
  
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr =
       (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&active_builtins.stack_storage;
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
  buffer_size = 0;
  active_builtins.buffer_capacity = 8;
  local_130 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_130);
  local_d8 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  local_108 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins;
  local_d0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2;
  for (lVar16 = 0; local_d0 != lVar16; lVar16 = lVar16 + 4) {
    id.id = *(uint32_t *)((long)&local_d8->id + lVar16);
    if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
         [id.id].type == TypeVariable) &&
       (var_00 = (CompilerMSL *)ParsedIR::get<spirv_cross::SPIRVariable>(local_130,id.id),
       *(int *)&(var_00->super_CompilerGLSL).super_Compiler.ir.spirv.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == 1)) {
      bi_type = Compiler::get_decoration((Compiler *)this,id,DecorationBuiltIn);
      bVar4 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)var_00);
      if ((bVar4) &&
         ((pSVar8 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)var_00),
          *(int *)&(pSVar8->super_IVariant).field_0xc != 0xf &&
          (pSVar8 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)var_00),
          *(int *)&(pSVar8->super_IVariant).field_0xc != 0x15)))) {
        bVar4 = Bitset::get(local_108,bi_type);
        if ((!bVar4) ||
           (bVar4 = Compiler::interface_variable_exists_in_entry_point((Compiler *)this,id.id),
           !bVar4)) goto LAB_0031f623;
        in_stack_fffffffffffffe68 = var_00;
        SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::push_back
                  (&active_builtins,
                   (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&stack0xfffffffffffffe68);
        bVar4 = is_direct_input_builtin(this,bi_type);
        if (bVar4) {
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          this->builtin_declaration = true;
          if ((bi_type == BuiltInTessCoord) &&
             (pSVar9 = Compiler::get_entry_point((Compiler *)this),
             ((pSVar9->flags).lower & 0x1000000) != 0)) {
            CompilerGLSL::to_expression_abi_cxx11_(&local_150,&this->super_CompilerGLSL,id.id,true);
            ::std::operator+(&local_170,"float2 ",&local_150);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffe68,&local_170,"In");
            ::std::__cxx11::string::append((string *)ep_args);
            this_00 = (string *)&stack0xfffffffffffffe68;
          }
          else {
            builtin_type_decl_abi_cxx11_(&local_150,this,bi_type,id.id);
            ::std::operator+(&local_170,&local_150," ");
            CompilerGLSL::to_expression_abi_cxx11_
                      ((string *)&outer_factor_initializer_id,&this->super_CompilerGLSL,id.id,true);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffe68,&local_170,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &outer_factor_initializer_id);
            ::std::__cxx11::string::append((string *)ep_args);
            ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
            this_00 = (string *)&outer_factor_initializer_id;
          }
          ::std::__cxx11::string::~string(this_00);
          ::std::__cxx11::string::~string((string *)&local_170);
          ::std::__cxx11::string::~string((string *)&local_150);
          builtin_qualifier_abi_cxx11_(&local_170,this,bi_type);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffe68," [[",&local_170);
          ::std::__cxx11::string::append((string *)ep_args);
          ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
          ::std::__cxx11::string::~string((string *)&local_170);
          if (bi_type == BuiltInSampleMask) {
            pSVar9 = Compiler::get_entry_point((Compiler *)this);
            bVar4 = Bitset::get(&pSVar9->flags,0x115e);
            if (bVar4) {
              uVar1 = (this->msl_options).msl_version;
              if (uVar1 < 20000) {
                pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&stack0xfffffffffffffe68,
                           "Post-depth coverage requires MSL 2.0.",(allocator *)&local_170);
                CompilerError::CompilerError(pCVar13,(string *)&stack0xfffffffffffffe68);
                __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if ((uVar1 < 0x4f4c) && ((this->msl_options).platform == macOS)) {
                pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&stack0xfffffffffffffe68,
                           "Post-depth coverage on Mac requires MSL 2.3.",(allocator *)&local_170);
                CompilerError::CompilerError(pCVar13,(string *)&stack0xfffffffffffffe68);
                __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              ::std::__cxx11::string::append((char *)ep_args);
            }
          }
          ::std::__cxx11::string::append((char *)ep_args);
          this->builtin_declaration = false;
        }
      }
      bVar4 = Compiler::has_extended_decoration
                        ((Compiler *)this,id.id,SPIRVCrossDecorationBuiltInDispatchBase);
      if (bVar4) {
        if ((this->msl_options).msl_version < 0x27d8) {
          __assert_fail("msl_options.supports_msl_version(1, 2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x316a,
                        "auto spirv_cross::CompilerMSL::entry_point_args_builtin(string &)::(anonymous class)::operator()(uint32_t, SPIRVariable &) const"
                       );
        }
        if (ep_args->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)ep_args);
        }
        pSVar8 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)var_00);
        in_R8 = (string *)(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
        (**(code **)((long)&in_R8[4].field_2 + 8))(&outer_factor_initializer_id,this,pSVar8,0);
        ::std::operator+(&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outer_factor_initializer_id," ");
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&inner_factor_initializer_id,&this->super_CompilerGLSL,id.id,true);
        ::std::operator+(&local_170,&local_150,(string *)&inner_factor_initializer_id);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffe68,&local_170," [[grid_origin]]");
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::__cxx11::string::~string((string *)&inner_factor_initializer_id);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::__cxx11::string::~string((string *)&outer_factor_initializer_id);
      }
      bVar4 = Compiler::has_extended_decoration
                        ((Compiler *)this,id.id,SPIRVCrossDecorationBuiltInStageInputSize);
      if (bVar4) {
        if ((this->msl_options).msl_version < 0x27d8) {
          __assert_fail("msl_options.supports_msl_version(1, 2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x3176,
                        "auto spirv_cross::CompilerMSL::entry_point_args_builtin(string &)::(anonymous class)::operator()(uint32_t, SPIRVariable &) const"
                       );
        }
        if (ep_args->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)ep_args);
        }
        pSVar8 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)var_00);
        in_R8 = (string *)(this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
        (**(code **)((long)&in_R8[4].field_2 + 8))(&outer_factor_initializer_id,this,pSVar8,0);
        ::std::operator+(&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &outer_factor_initializer_id," ");
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&inner_factor_initializer_id,&this->super_CompilerGLSL,id.id,true);
        ::std::operator+(&local_170,&local_150,(string *)&inner_factor_initializer_id);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xfffffffffffffe68,&local_170," [[grid_size]]");
        ::std::__cxx11::string::append((string *)ep_args);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::__cxx11::string::~string((string *)&inner_factor_initializer_id);
        ::std::__cxx11::string::~string((string *)&local_150);
        ::std::__cxx11::string::~string((string *)&outer_factor_initializer_id);
      }
    }
LAB_0031f623:
  }
  ParsedIR::LoopLock::~LoopLock(&local_100);
  ppVar15 = active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
            ptr;
  for (lVar16 = active_builtins.
                super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size
                << 4; lVar16 != 0; lVar16 = lVar16 + -0x10) {
    uVar5 = ensure_correct_builtin_type
                      (this,*(uint32_t *)&(ppVar15->first->super_IVariant).field_0xc,ppVar15->second
                      );
    *(uint32_t *)&(ppVar15->first->super_IVariant).field_0xc = uVar5;
    ppVar15 = ppVar15 + 1;
  }
  if (this->needs_base_vertex_arg == Yes) {
    built_in_func_arg_abi_cxx11_
              ((string *)&stack0xfffffffffffffe68,this,BuiltInBaseVertex,
               ep_args->_M_string_length != 0);
    ::std::__cxx11::string::append((string *)ep_args);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  if (this->needs_base_instance_arg == Yes) {
    built_in_func_arg_abi_cxx11_
              ((string *)&stack0xfffffffffffffe68,this,BuiltInBaseInstance,
               ep_args->_M_string_length != 0);
    ::std::__cxx11::string::append((string *)ep_args);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  if (this->capture_output_to_buffer != true) goto LAB_0031ff78;
  if ((this->stage_out_var_id).id != 0) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    pSVar8 = get_stage_out_struct_type(this);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar8,0);
    in_R8 = &this->output_buffer_var_name;
    join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x3b32c2,(char (*) [8])&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
               (char (*) [3])in_R8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
               (char (*) [11])&(this->msl_options).shader_output_buffer_index,(uint *)")]]",
               (char (*) [4])in_stack_fffffffffffffe68);
    ::std::__cxx11::string::append((string *)ep_args);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
    ::std::__cxx11::string::~string((string *)&local_170);
  }
  bVar4 = is_tesc_shader(this);
  if (bVar4) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    join<char_const(&)[43],unsigned_int&,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,
               (spirv_cross *)"constant uint* spvIndirectParams [[buffer(",
               (char (*) [43])&(this->msl_options).indirect_params_buffer_index,(uint *)")]]",
               (char (*) [4])in_R8);
    ::std::__cxx11::string::append((string *)ep_args);
LAB_0031fa57:
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
  else if (((this->stage_out_var_id).id != 0) &&
          ((EVar6 = Compiler::get_execution_model((Compiler *)this), EVar6 != ExecutionModelVertex
           || ((this->msl_options).vertex_for_tessellation == false)))) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    join<char_const(&)[41],unsigned_int&,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,
               (spirv_cross *)"device uint* spvIndirectParams [[buffer(",
               (char (*) [41])&(this->msl_options).indirect_params_buffer_index,(uint *)")]]",
               (char (*) [4])in_R8);
    ::std::__cxx11::string::append((string *)ep_args);
    goto LAB_0031fa57;
  }
  EVar6 = Compiler::get_execution_model((Compiler *)this);
  if ((((EVar6 == ExecutionModelVertex) && ((this->msl_options).vertex_for_tessellation == true)) &&
      ((local_108->lower & 0x40000000020) != 0)) &&
     (IVar7 = (this->msl_options).vertex_index_type, IVar7 != None)) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
      IVar7 = (this->msl_options).vertex_index_type;
    }
    if (IVar7 == UInt32) {
      join<char_const(&)[20],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device uint* ",
                 (char (*) [20])&this->index_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                 (char (*) [11])&(this->msl_options).shader_index_buffer_index,(uint *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::append((string *)ep_args);
    }
    else {
      if (IVar7 != UInt16) goto LAB_0031fb44;
      join<char_const(&)[22],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ushort* ",
                 (char (*) [22])&this->index_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                 (char (*) [11])&(this->msl_options).shader_index_buffer_index,(uint *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::append((string *)ep_args);
    }
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
  }
LAB_0031fb44:
  bVar4 = is_tesc_shader(this);
  if (bVar4) {
    if ((this->patch_stage_out_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar8 = get_patch_stage_out_struct_type(this);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar8,0);
      convert_to_string<unsigned_int,_0>
                (&local_150,&(this->msl_options).shader_patch_output_buffer_index);
      join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x3b32c2,(char (*) [8])&local_170
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
                 (char (*) [3])&this->patch_output_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                 (char (*) [11])&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_170);
    }
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    get_tess_factor_struct_name_abi_cxx11_(&local_170,this);
    convert_to_string<unsigned_int,_0>
              (&local_150,&(this->msl_options).shader_tess_factor_buffer_index);
    join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
              ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x3b32c2,(char (*) [8])&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
               (char (*) [3])&this->tess_factor_buffer_var_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
               (char (*) [11])&local_150,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
               (char (*) [4])in_stack_fffffffffffffe68);
    ::std::__cxx11::string::append((string *)ep_args);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_170);
    outer_factor_initializer_id = 0;
    inner_factor_initializer_id = 0;
    ParsedIR::create_loop_hard_lock(local_130);
    pTVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar16 = 0; sVar3 << 2 != lVar16; lVar16 = lVar16 + 4) {
      uVar1 = *(uint *)((long)&pTVar2->id + lVar16);
      if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[uVar1].type == TypeVariable) {
        pSVar10 = ParsedIR::get<spirv_cross::SPIRVariable>(local_130,uVar1);
        bVar4 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,DecorationBuiltIn)
        ;
        if ((bVar4 && pSVar10->storage == StorageClassOutput) && ((pSVar10->initializer).id != 0)) {
          uVar5 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pSVar10->super_IVariant).self.id,
                             DecorationBuiltIn);
          puVar14 = &inner_factor_initializer_id;
          if (uVar5 != 0xc) {
            if (uVar5 != 0xb) goto LAB_0031fd3c;
            puVar14 = &outer_factor_initializer_id;
          }
          *puVar14 = (pSVar10->initializer).id;
        }
      }
LAB_0031fd3c:
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&stack0xfffffffffffffe68);
    if ((outer_factor_initializer_id != 0) &&
       (pSVar11 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                            ((Compiler *)this,outer_factor_initializer_id),
       pSVar11 != (SPIRConstant *)0x0)) {
      pSVar12 = Compiler::get<spirv_cross::SPIRFunction>
                          ((Compiler *)this,
                           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      in_stack_fffffffffffffe68 = this;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar12->fixup_hooks_in,(function<void_()> *)&stack0xfffffffffffffe68);
      ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe68);
    }
    if ((inner_factor_initializer_id != 0) &&
       (pSVar11 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                            ((Compiler *)this,inner_factor_initializer_id),
       pSVar11 != (SPIRConstant *)0x0)) {
      pSVar12 = Compiler::get<spirv_cross::SPIRFunction>
                          ((Compiler *)this,
                           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      Compiler::is_tessellating_triangles((Compiler *)this);
      in_stack_fffffffffffffe68 = this;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar12->fixup_hooks_in,(function<void_()> *)&stack0xfffffffffffffe68);
      ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe68);
    }
    if ((this->stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      if ((this->msl_options).multi_patch_workgroup == true) {
        pSVar8 = get_stage_in_struct_type(this);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar8,0);
        convert_to_string<unsigned_int,_0>
                  (&local_150,&(this->msl_options).shader_input_buffer_index);
        join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&stack0xfffffffffffffe68,(spirv_cross *)0x3b32c2,
                   (char (*) [8])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
                   (char (*) [3])&this->input_buffer_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                   (char (*) [11])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                   (char (*) [4])in_stack_fffffffffffffe68);
        ::std::__cxx11::string::append((string *)ep_args);
      }
      else {
        pSVar8 = get_stage_in_struct_type(this);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar8,0);
        convert_to_string<unsigned_int,_0>(&local_150,&(this->msl_options).shader_input_wg_index);
        join<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[16],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"threadgroup ",
                   (char (*) [13])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
                   (char (*) [3])&this->input_wg_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[threadgroup(",(char (*) [16])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                   (char (*) [4])in_stack_fffffffffffffe68);
        ::std::__cxx11::string::append((string *)ep_args);
      }
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_170);
    }
  }
LAB_0031ff78:
  bVar4 = is_tese_shader(this);
  if ((bVar4) && ((this->msl_options).raw_buffer_tese_input == true)) {
    if ((this->patch_stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar8 = get_patch_stage_in_struct_type(this);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar8,0);
      convert_to_string<unsigned_int,_0>
                (&local_150,&(this->msl_options).shader_patch_input_buffer_index);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ",
                 (char (*) [14])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
                 (char (*) [3])&this->patch_input_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                 (char (*) [11])&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_170);
    }
    if ((this->tess_level_outer_var_id).id != 0 || (this->tess_level_inner_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      get_tess_factor_struct_name_abi_cxx11_(&local_170,this);
      convert_to_string<unsigned_int,_0>
                (&local_150,&(this->msl_options).shader_tess_factor_buffer_index);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ",
                 (char (*) [14])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
                 (char (*) [3])&this->tess_factor_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                 (char (*) [11])&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_170);
    }
    if ((this->stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      pSVar8 = get_stage_in_struct_type(this);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_170,this,pSVar8,0);
      convert_to_string<unsigned_int,_0>(&local_150,&(this->msl_options).shader_input_buffer_index);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&stack0xfffffffffffffe68,(spirv_cross *)"const device ",
                 (char (*) [14])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39cbba,
                 (char (*) [3])&this->input_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b326a,
                 (char (*) [11])&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 (char (*) [4])in_stack_fffffffffffffe68);
      ::std::__cxx11::string::append((string *)ep_args);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
      ::std::__cxx11::string::~string((string *)&local_150);
      ::std::__cxx11::string::~string((string *)&local_170);
    }
  }
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::~SmallVector
            (&active_builtins);
  return;
}

Assistant:

void CompilerMSL::entry_point_args_builtin(string &ep_args)
{
	// Builtin variables
	SmallVector<pair<SPIRVariable *, BuiltIn>, 8> active_builtins;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if (var.storage != StorageClassInput)
			return;

		auto bi_type = BuiltIn(get_decoration(var_id, DecorationBuiltIn));

		// Don't emit SamplePosition as a separate parameter. In the entry
		// point, we get that by calling get_sample_position() on the sample ID.
		if (is_builtin_variable(var) &&
		    get_variable_data_type(var).basetype != SPIRType::Struct &&
		    get_variable_data_type(var).basetype != SPIRType::ControlPointArray)
		{
			// If the builtin is not part of the active input builtin set, don't emit it.
			// Relevant for multiple entry-point modules which might declare unused builtins.
			if (!active_input_builtins.get(bi_type) || !interface_variable_exists_in_entry_point(var_id))
				return;

			// Remember this variable. We may need to correct its type.
			active_builtins.push_back(make_pair(&var, bi_type));

			if (is_direct_input_builtin(bi_type))
			{
				if (!ep_args.empty())
					ep_args += ", ";

				// Handle HLSL-style 0-based vertex/instance index.
				builtin_declaration = true;

				// Handle different MSL gl_TessCoord types. (float2, float3)
				if (bi_type == BuiltInTessCoord && get_entry_point().flags.get(ExecutionModeQuads))
					ep_args += "float2 " + to_expression(var_id) + "In";
				else
					ep_args += builtin_type_decl(bi_type, var_id) + " " + to_expression(var_id);

				ep_args += " [[" + builtin_qualifier(bi_type);
				if (bi_type == BuiltInSampleMask && get_entry_point().flags.get(ExecutionModePostDepthCoverage))
				{
					if (!msl_options.supports_msl_version(2))
						SPIRV_CROSS_THROW("Post-depth coverage requires MSL 2.0.");
					if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
						SPIRV_CROSS_THROW("Post-depth coverage on Mac requires MSL 2.3.");
					ep_args += ", post_depth_coverage";
				}
				ep_args += "]]";
				builtin_declaration = false;
			}
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInDispatchBase))
		{
			// This is a special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the base that was passed to vkCmdDispatchBase() or vkCmdDrawIndexed(). If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_origin]]";
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInStageInputSize))
		{
			// This is another special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the number of vertices and instances to draw. If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_size]]";
		}
	});

	// Correct the types of all encountered active builtins. We couldn't do this before
	// because ensure_correct_builtin_type() may increase the bound, which isn't allowed
	// while iterating over IDs.
	for (auto &var : active_builtins)
		var.first->basetype = ensure_correct_builtin_type(var.first->basetype, var.second);

	// Handle HLSL-style 0-based vertex/instance index.
	if (needs_base_vertex_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseVertex, !ep_args.empty());

	if (needs_base_instance_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseInstance, !ep_args.empty());

	if (capture_output_to_buffer)
	{
		// Add parameters to hold the indirect draw parameters and the shader output. This has to be handled
		// specially because it needs to be a pointer, not a reference.
		if (stage_out_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", type_to_glsl(get_stage_out_struct_type()), "* ", output_buffer_var_name,
			                " [[buffer(", msl_options.shader_output_buffer_index, ")]]");
		}

		if (is_tesc_shader())
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("constant uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}
		else if (stage_out_var_id &&
		         !(get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("device uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}

		if (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation &&
		    (active_input_builtins.get(BuiltInVertexIndex) || active_input_builtins.get(BuiltInVertexId)) &&
		    msl_options.vertex_index_type != Options::IndexType::None)
		{
			// Add the index buffer so we can set gl_VertexIndex correctly.
			if (!ep_args.empty())
				ep_args += ", ";
			switch (msl_options.vertex_index_type)
			{
			case Options::IndexType::None:
				break;
			case Options::IndexType::UInt16:
				ep_args += join("const device ushort* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			case Options::IndexType::UInt32:
				ep_args += join("const device uint* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			}
		}

		// Tessellation control shaders get three additional parameters:
		// a buffer to hold the per-patch data, a buffer to hold the per-patch
		// tessellation levels, and a block of workgroup memory to hold the
		// input control point data.
		if (is_tesc_shader())
		{
			if (patch_stage_out_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    join("device ", type_to_glsl(get_patch_stage_out_struct_type()), "* ", patch_output_buffer_var_name,
				         " [[buffer(", convert_to_string(msl_options.shader_patch_output_buffer_index), ")]]");
			}
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name, " [[buffer(",
			                convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");

			// Initializer for tess factors must be handled specially since it's never declared as a normal variable.
			uint32_t outer_factor_initializer_id = 0;
			uint32_t inner_factor_initializer_id = 0;
			ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
				if (!has_decoration(var.self, DecorationBuiltIn) || var.storage != StorageClassOutput || !var.initializer)
					return;

				BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				if (builtin == BuiltInTessLevelInner)
					inner_factor_initializer_id = var.initializer;
				else if (builtin == BuiltInTessLevelOuter)
					outer_factor_initializer_id = var.initializer;
			});

			const SPIRConstant *c = nullptr;

			if (outer_factor_initializer_id && (c = maybe_get<SPIRConstant>(outer_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [=]()
				    {
					    uint32_t components = is_tessellating_triangles() ? 3 : 4;
					    for (uint32_t i = 0; i < components; i++)
					    {
						    statement(builtin_to_glsl(BuiltInTessLevelOuter, StorageClassOutput), "[", i,
						              "] = ", "half(", to_expression(c->subconstants[i]), ");");
					    }
				    });
			}

			if (inner_factor_initializer_id && (c = maybe_get<SPIRConstant>(inner_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				if (is_tessellating_triangles())
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), " = ", "half(",
						          to_expression(c->subconstants[0]), ");");
					});
				}
				else
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						for (uint32_t i = 0; i < 2; i++)
						{
							statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), "[", i, "] = ",
							          "half(", to_expression(c->subconstants[i]), ");");
						}
					});
				}
			}

			if (stage_in_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				if (msl_options.multi_patch_workgroup)
				{
					ep_args += join("device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
					                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
				}
				else
				{
					ep_args += join("threadgroup ", type_to_glsl(get_stage_in_struct_type()), "* ", input_wg_var_name,
					                " [[threadgroup(", convert_to_string(msl_options.shader_input_wg_index), ")]]");
				}
			}
		}
	}
	// Tessellation evaluation shaders get three additional parameters:
	// a buffer for the per-patch data, a buffer for the per-patch
	// tessellation levels, and a buffer for the control point data.
	if (is_tese_shader() && msl_options.raw_buffer_tese_input)
	{
		if (patch_stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("const device ", type_to_glsl(get_patch_stage_in_struct_type()), "* ", patch_input_buffer_var_name,
			         " [[buffer(", convert_to_string(msl_options.shader_patch_input_buffer_index), ")]]");
		}

		if (tess_level_inner_var_id || tess_level_outer_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");
		}

		if (stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
		}
	}
}